

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O2

void __thiscall cancel_handler::operator()(cancel_handler *this,error_code *e)

{
  cancel_handler func;
  ostream *poVar1;
  callback<void_()> cStack_18;
  
  if ((e->_M_cat != booster::aio::aio_error_cat) || (e->_M_value != 1)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar1 = std::operator<<(poVar1,
                             "e==booster::system::error_code(booster::aio::aio_error::canceled,booster::aio::aio_error_cat)"
                            );
    poVar1 = std::operator<<(poVar1," at ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x82);
    std::endl<char,std::char_traits<char>>(poVar1);
    return_code = 1;
  }
  cancel_called = cancel_called + 1;
  func = (cancel_handler)this->srv;
  booster::callback<void_()>::callback<cancel_handler>(&cStack_18,func);
  booster::aio::io_service::post((callback *)func.srv);
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&cStack_18.call_ptr);
  return;
}

Assistant:

void operator()(booster::system::error_code const &e) const
	{
		TEST(e==booster::system::error_code(booster::aio::aio_error::canceled,booster::aio::aio_error_cat));
		cancel_called ++;
		srv->post(*this);
	}